

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwitchingFunction.cpp
# Opt level: O0

void __thiscall
OpenMD::SwitchingFunction::setSwitch(SwitchingFunction *this,RealType rinner,RealType router)

{
  double *in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  CubicSpline *this_00;
  double in_XMM1_Qa;
  int i;
  RealType rvaldi5;
  RealType rvaldi4;
  RealType rvaldi3;
  RealType rvaldi2;
  RealType rvaldi;
  RealType rval5;
  RealType rval4;
  RealType rval3;
  RealType rval2;
  RealType rval;
  RealType yval;
  RealType r;
  RealType dx;
  RealType c5;
  RealType c4;
  RealType c3;
  RealType c0;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  int iVar2;
  CubicSpline *in_stack_ffffffffffffff60;
  
  if (in_XMM1_Qa < in_XMM0_Qa) {
    snprintf(painCave.errMsg,2000,
             "SwitchingFunction::setSwitch was given rinner (%lf) which was\n\tlarger than router (%lf).\n"
             ,in_XMM0_Qa,in_XMM1_Qa);
    painCave.severity = 1;
    painCave.isFatal = 1;
    simError();
  }
  if (in_XMM1_Qa < 0.0) {
    snprintf(painCave.errMsg,2000,
             "SwitchingFunction::setSwitch was given router (%lf) which was\n\tless than zero.\n",
             in_XMM1_Qa);
    painCave.severity = 1;
    painCave.isFatal = 1;
    simError();
  }
  if (in_XMM0_Qa < 0.0) {
    snprintf(painCave.errMsg,2000,
             "SwitchingFunction::setSwitch was given rinner (%lf) which was\n\tless than zero.\n",
             in_XMM1_Qa);
    painCave.severity = 1;
    painCave.isFatal = 1;
    simError();
  }
  *in_RDI = in_XMM0_Qa;
  in_RDI[1] = in_XMM1_Qa;
  in_RDI[2] = *in_RDI * *in_RDI;
  in_RDI[3] = in_RDI[1] * in_RDI[1];
  if (1e-08 <= in_XMM1_Qa - in_XMM0_Qa) {
    if (*(int *)(in_RDI + 4) == 1) {
      *(undefined1 *)((long)in_RDI + 0x25) = 0;
      for (iVar2 = 0; iVar2 < *(int *)(in_RDI + 5); iVar2 = iVar2 + 1) {
        dVar1 = 1.0 / (in_RDI[1] - *in_RDI);
        this_00 = (CubicSpline *)(dVar1 * dVar1 * dVar1 * dVar1 * dVar1);
        std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x2bb18a);
        CubicSpline::addPoint
                  (this_00,(RealType)CONCAT44(iVar2,in_stack_ffffffffffffff58),(RealType)in_RDI);
      }
    }
    else {
      *(undefined1 *)((long)in_RDI + 0x25) = 1;
      std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2bb1c2);
      CubicSpline::addPoint
                (in_stack_ffffffffffffff60,
                 (RealType)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                 (RealType)in_RDI);
      std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2bb1e9);
      CubicSpline::addPoint
                (in_stack_ffffffffffffff60,
                 (RealType)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                 (RealType)in_RDI);
    }
    *(undefined1 *)((long)in_RDI + 0x24) = 1;
  }
  return;
}

Assistant:

void SwitchingFunction::setSwitch(RealType rinner, RealType router) {
    if (router < rinner) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "SwitchingFunction::setSwitch was given rinner (%lf) which was\n"
               "\tlarger than router (%lf).\n",
               rinner, router);
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }
    if (router < 0.0) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "SwitchingFunction::setSwitch was given router (%lf) which was\n"
               "\tless than zero.\n",
               router);
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }
    if (rinner < 0.0) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "SwitchingFunction::setSwitch was given rinner (%lf) which was\n"
               "\tless than zero.\n",
               router);
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    rin_   = rinner;
    rout_  = router;
    rin2_  = rin_ * rin_;
    rout2_ = rout_ * rout_;

    if ((router - rinner) < 1.0e-8) {
      // no reason to set up spline if the switching region is tiny
      return;
    }

    // setup r -> sw lookup spline
    if (functionType_ == fifth_order_poly) {
      isCubic_    = false;
      RealType c0 = 1.0;
      RealType c3 = -10.0;
      RealType c4 = 15.0;
      RealType c5 = -6.0;

      RealType dx, r, yval, rval, rval2, rval3, rval4, rval5;
      RealType rvaldi, rvaldi2, rvaldi3, rvaldi4, rvaldi5;

      dx = (rout_ - rin_) / RealType(np_ - 1);

      for (int i = 0; i < np_; i++) {
        r       = rin_ + RealType(i) * dx;
        rval    = (r - rin_);
        rval2   = rval * rval;
        rval3   = rval2 * rval;
        rval4   = rval2 * rval2;
        rval5   = rval3 * rval2;
        rvaldi  = 1.0 / (rout_ - rin_);
        rvaldi2 = rvaldi * rvaldi;
        rvaldi3 = rvaldi2 * rvaldi;
        rvaldi4 = rvaldi2 * rvaldi2;
        rvaldi5 = rvaldi3 * rvaldi2;
        yval    = c0 + c3 * rval3 * rvaldi3 + c4 * rval4 * rvaldi4 +
               c5 * rval5 * rvaldi5;
        switchSpline_->addPoint(r, yval);
      }
    } else {
      // cubic splines only need 2 points to do a cubic switching function...
      isCubic_ = true;
      switchSpline_->addPoint(rin_, 1.0);
      switchSpline_->addPoint(rout_, 0.0);
    }
    haveSpline_ = true;
    return;
  }